

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O1

void pnga_abs_value(Integer g_a)

{
  long lVar1;
  Integer *pIVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Integer ndim;
  Integer type;
  Integer hi [7];
  Integer lo [7];
  Integer local_98;
  Integer local_90;
  Integer local_88 [7];
  Integer aIStack_50 [8];
  
  pnga_inquire(g_a,&local_90,&local_98,local_88);
  if (local_98 != 0) {
    lVar1 = local_98 + -1;
    auVar4._8_4_ = (int)lVar1;
    auVar4._0_8_ = lVar1;
    auVar4._12_4_ = (int)((ulong)lVar1 >> 0x20);
    pIVar2 = aIStack_50 + local_98;
    uVar3 = 0;
    auVar4 = auVar4 ^ _DAT_001b2060;
    do {
      auVar5._8_4_ = (int)uVar3;
      auVar5._0_8_ = uVar3;
      auVar5._12_4_ = (int)(uVar3 >> 0x20);
      auVar5 = (auVar5 | _DAT_001b2050) ^ _DAT_001b2060;
      if ((bool)(~(auVar5._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar5._0_4_ ||
                  auVar4._4_4_ < auVar5._4_4_) & 1)) {
        *pIVar2 = 1;
      }
      if ((auVar5._12_4_ != auVar4._12_4_ || auVar5._8_4_ <= auVar4._8_4_) &&
          auVar5._12_4_ <= auVar4._12_4_) {
        pIVar2[-1] = 1;
      }
      uVar3 = uVar3 + 2;
      pIVar2 = pIVar2 + -2;
    } while ((local_98 + 1U & 0xfffffffffffffffe) != uVar3);
    local_98 = 0;
  }
  _ga_sync_begin = 1;
  gai_oper_elem(g_a,aIStack_50 + 1,local_88,(void *)0x0,0);
  return;
}

Assistant:

void pnga_abs_value(Integer g_a)
{
   Integer type, ndim;
   Integer lo[MAXDIM],hi[MAXDIM];

    pnga_inquire(g_a,  &type, &ndim, hi);
    while(ndim){
        lo[ndim-1]=1;
        ndim--;
    }
    _ga_sync_begin = 1; /*just to be on the safe side*/
    gai_oper_elem(g_a, lo, hi, NULL, OP_ABS);
}